

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

Statement *
slang::ast::ImmediateAssertionStatement::fromSyntax
          (Compilation *compilation,ImmediateAssertionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  not_null<slang::syntax::ActionBlockSyntax_*> *this;
  DeferredAssertionSyntax *pDVar1;
  Compilation *compilation_00;
  bool bVar2;
  bool bVar3;
  AssertionKind AVar4;
  int iVar5;
  ParenthesizedExpressionSyntax *pPVar6;
  ExpressionSyntax *pEVar7;
  undefined4 extraout_var;
  ActionBlockSyntax *pAVar8;
  Statement *stmt;
  SyntaxNode *this_01;
  StatementSyntax *pSVar9;
  Statement *stmt_00;
  ImmediateAssertionStatement *stmt_01;
  SourceRange sourceRange;
  bool isFinal;
  bool isDeferred;
  ImmediateAssertionStatementSyntax *local_70;
  Statement *ifFalse;
  Statement *ifTrue;
  AssertionKind assertKind;
  Expression *local_50;
  Compilation *local_48;
  SourceRange local_40;
  Expression *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  local_48 = compilation;
  AVar4 = SemanticFacts::getAssertKind((syntax->super_StatementSyntax).super_SyntaxNode.kind);
  local_70 = syntax;
  assertKind = AVar4;
  pPVar6 = not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::get(&syntax->expr);
  pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pPVar6->expression);
  iVar5 = Expression::bind((int)pEVar7,(sockaddr *)context,0);
  this_00 = (Expression *)CONCAT44(extraout_var,iVar5);
  bVar2 = Expression::bad(this_00);
  bVar3 = true;
  if (!bVar2) {
    bVar3 = ASTContext::requireBooleanConvertible(context,this_00);
    bVar3 = !bVar3;
  }
  ifTrue = (Statement *)0x0;
  ifFalse = (Statement *)0x0;
  this = &local_70->action;
  local_50 = this_00;
  pAVar8 = not_null<slang::syntax::ActionBlockSyntax_*>::get(this);
  stmt = (Statement *)0x0;
  if (pAVar8->statement != (StatementSyntax *)0x0) {
    pAVar8 = not_null<slang::syntax::ActionBlockSyntax_*>::get(this);
    iVar5 = Statement::bind((int)pAVar8->statement,(sockaddr *)context,(socklen_t)stmtCtx);
    stmt = (Statement *)CONCAT44(extraout_var_00,iVar5);
    ifTrue = stmt;
  }
  pAVar8 = not_null<slang::syntax::ActionBlockSyntax_*>::get(this);
  if (pAVar8->elseClause == (ElseClauseSyntax *)0x0) {
    stmt_00 = (Statement *)0x0;
  }
  else {
    pAVar8 = not_null<slang::syntax::ActionBlockSyntax_*>::get(this);
    this_01 = not_null<slang::syntax::SyntaxNode_*>::get(&pAVar8->elseClause->clause);
    pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this_01);
    iVar5 = Statement::bind((int)pSVar9,(sockaddr *)context,(socklen_t)stmtCtx);
    stmt_00 = (Statement *)CONCAT44(extraout_var_01,iVar5);
    ifFalse = stmt_00;
  }
  pDVar1 = local_70->delay;
  isFinal = false;
  isDeferred = pDVar1 != (DeferredAssertionSyntax *)0x0;
  if (isDeferred) {
    isFinal = (pDVar1->finalKeyword).info != (Info *)0x0;
  }
  if (((AVar4 & ~Assume) == CoverProperty) && (stmt_00 != (Statement *)0x0)) {
    pAVar8 = not_null<slang::syntax::ActionBlockSyntax_*>::get(this);
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&pAVar8->elseClause->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0xc0008,sourceRange);
    bVar3 = true;
  }
  if (pDVar1 != (DeferredAssertionSyntax *)0x0) {
    if (stmt != (Statement *)0x0) {
      checkDeferredAssertAction(stmt,context);
    }
    if (stmt_00 != (Statement *)0x0) {
      checkDeferredAssertAction(stmt_00,context);
    }
  }
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_70);
  compilation_00 = local_48;
  stmt_01 = BumpAllocator::
            emplace<slang::ast::ImmediateAssertionStatement,slang::ast::AssertionKind&,slang::ast::Expression_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,bool&,bool&,slang::SourceRange>
                      (&local_48->super_BumpAllocator,&assertKind,local_50,&ifTrue,&ifFalse,
                       &isDeferred,&isFinal,&local_40);
  if (((bVar3) || ((ifTrue != (Statement *)0x0 && (ifTrue->kind == Invalid)))) ||
     ((ifFalse != (Statement *)0x0 && (ifFalse->kind == Invalid)))) {
    stmt_01 = (ImmediateAssertionStatement *)
              Statement::badStmt(compilation_00,&stmt_01->super_Statement);
  }
  return &stmt_01->super_Statement;
}

Assistant:

Statement& ImmediateAssertionStatement::fromSyntax(Compilation& compilation,
                                                   const ImmediateAssertionStatementSyntax& syntax,
                                                   const ASTContext& context,
                                                   StatementContext& stmtCtx) {
    AssertionKind assertKind = SemanticFacts::getAssertKind(syntax.kind);
    auto& cond = Expression::bind(*syntax.expr->expression, context);
    bool bad = cond.bad();

    if (!bad && !context.requireBooleanConvertible(cond))
        bad = true;

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    bool isDeferred = syntax.delay != nullptr;
    bool isFinal = false;
    if (isDeferred)
        isFinal = syntax.delay->finalKeyword.valid();

    bool isCover = assertKind == AssertionKind::CoverProperty ||
                   assertKind == AssertionKind::CoverSequence;
    if (isCover && ifFalse) {
        context.addDiag(diag::CoverStmtNoFail, syntax.action->elseClause->sourceRange());
        bad = true;
    }

    if (isDeferred) {
        if (ifTrue)
            checkDeferredAssertAction(*ifTrue, context);
        if (ifFalse)
            checkDeferredAssertAction(*ifFalse, context);
    }

    auto result = compilation.emplace<ImmediateAssertionStatement>(assertKind, cond, ifTrue,
                                                                   ifFalse, isDeferred, isFinal,
                                                                   syntax.sourceRange());
    if (bad || (ifTrue && ifTrue->bad()) || (ifFalse && ifFalse->bad()))
        return badStmt(compilation, result);

    return *result;
}